

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::session_impl::verify_incoming_interface(session_impl *this,address *addr)

{
  shared_ptr<libtorrent::aux::listen_socket_t> *psVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it_00;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:5217:6)>
  local_38;
  
  __it_00._M_current =
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)psVar1 - (long)__it_00._M_current >> 6;
  local_38._M_pred.addr =
       (anon_class_8_1_898948ef_for__M_pred)(anon_class_8_1_898948ef_for__M_pred)addr;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
              ::operator()(&local_38,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar2) goto LAB_002cd84d;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
              ::operator()(&local_38,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar2) goto LAB_002cd84d;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
              ::operator()(&local_38,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar2) goto LAB_002cd84d;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
              ::operator()(&local_38,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar2) goto LAB_002cd84d;
      __it_00._M_current = __it_00._M_current + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)psVar1 - (long)__it_00._M_current >> 4;
  if (lVar3 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar3 != 2) {
      __it._M_current = psVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
                  ::operator()(&local_38,__it_00), __it._M_current = __it_00._M_current, bVar2))
      goto LAB_002cd84d;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
            ::operator()(&local_38,__it);
    if (bVar2) goto LAB_002cd84d;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
          ::operator()(&local_38,__it_00);
  __it._M_current = psVar1;
  if (bVar2) {
    __it._M_current = __it_00._M_current;
  }
LAB_002cd84d:
  if (__it._M_current ==
      (this->m_listen_sockets).
      super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = false;
  }
  else {
    bVar2 = (bool)(((((__it._M_current)->
                     super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->flags).m_val & 1);
  }
  return bVar2;
}

Assistant:

bool session_impl::verify_incoming_interface(address const& addr) const
	{
		auto const iter = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&addr](std::shared_ptr<listen_socket_t> const& s)
			{ return s->local_endpoint.address() == addr; });
		return iter == m_listen_sockets.end()
			? false
			: bool((*iter)->flags & listen_socket_t::accept_incoming);
	}